

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool SetPropertyCommand::HandleSourceFileDirectoryScopes
               (cmExecutionStatus *status,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_directories,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_target_directories,
               vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *directory_makefiles)

{
  pointer *pppcVar1;
  pointer pbVar2;
  long *plVar3;
  iterator iVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  cmMakefile *pcVar7;
  cmTarget *this;
  long *plVar8;
  bool bVar9;
  long *plVar10;
  pointer pbVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  cmMakefile *current_dir_mf;
  string absolute_dir_path;
  cmMakefile *dir_mf;
  unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
  directory_makefiles_set;
  string local_100;
  cmExecutionStatus *local_e0;
  cmMakefile *local_d8;
  pointer local_d0;
  undefined1 local_c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  cmMakefile *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  string *local_90;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_68._M_allocated_capacity = (size_type)&uStack_38;
  local_68._8_8_ = 1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  local_d8 = status->Makefile;
  pbVar11 = (source_file_directories->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (source_file_directories->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = status;
  local_a8 = source_file_target_directories;
  local_98 = source_file_directories;
  if (pbVar11 != pbVar2) {
    local_d0 = &status->Error;
    do {
      psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_d8);
      cmsys::SystemTools::CollapseFullPath((string *)local_c8,pbVar11,psVar5);
      pcVar6 = cmMakefile::GetGlobalGenerator(local_e0->Makefile);
      pcVar7 = cmGlobalGenerator::FindMakefile(pcVar6,(string *)local_c8);
      local_a0 = pcVar7;
      if (pcVar7 == (cmMakefile *)0x0) {
        local_100.field_2._8_8_ = (pbVar11->_M_dataplus)._M_p;
        local_100.field_2._M_allocated_capacity = pbVar11->_M_string_length;
        local_100._M_dataplus._M_p = (pointer)0x1d;
        local_100._M_string_length = 0x78c600;
        views._M_len = 2;
        views._M_array = (iterator)&local_100;
        cmCatViews_abi_cxx11_(&local_88,views);
        std::__cxx11::string::_M_assign((string *)local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        plVar3 = *(long **)(local_68._M_allocated_capacity +
                           ((ulong)pcVar7 % (ulong)local_68._8_8_) * 8);
        plVar8 = (long *)0x0;
        if ((plVar3 != (long *)0x0) &&
           (plVar8 = plVar3, plVar10 = (long *)*plVar3, pcVar7 != (cmMakefile *)((long *)*plVar3)[1]
           )) {
          while (plVar3 = (long *)*plVar10, plVar3 != (long *)0x0) {
            plVar8 = (long *)0x0;
            if (((ulong)plVar3[1] % (ulong)local_68._8_8_ != (ulong)pcVar7 % (ulong)local_68._8_8_)
               || (plVar8 = plVar10, plVar10 = plVar3, pcVar7 == (cmMakefile *)plVar3[1]))
            goto LAB_003bc92b;
          }
          plVar8 = (long *)0x0;
        }
LAB_003bc92b:
        if ((plVar8 == (long *)0x0) || (*plVar8 == 0)) {
          iVar4._M_current =
               (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmMakefile*,std::allocator<cmMakefile*>>::
            _M_realloc_insert<cmMakefile*const&>
                      ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)directory_makefiles,iVar4,
                       &local_a0);
          }
          else {
            *iVar4._M_current = pcVar7;
            pppcVar1 = &(directory_makefiles->
                        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          local_100._M_dataplus._M_p = (pointer)&local_68;
          std::
          _Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<cmMakefile*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<cmMakefile*,false>>>>
                    ((_Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_100._M_dataplus._M_p,&local_a0,&local_100);
        }
      }
      if ((cmMakefile *)local_c8._0_8_ != (cmMakefile *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if (pcVar7 == (cmMakefile *)0x0) goto LAB_003bcbca;
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar2);
  }
  pbVar11 = (local_a8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (local_a8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != local_d0) {
    local_90 = (string *)&local_e0->Error;
    do {
      this = cmMakefile::FindTargetToUse(local_d8,pbVar11,false);
      if (this == (cmTarget *)0x0) {
        local_100.field_2._8_8_ = (pbVar11->_M_dataplus)._M_p;
        local_100.field_2._M_allocated_capacity = pbVar11->_M_string_length;
        local_100._M_dataplus._M_p = (pointer)0x2f;
        local_100._M_string_length = 0x78c61e;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_100;
        cmCatViews_abi_cxx11_((string *)local_c8,views_00);
        std::__cxx11::string::_M_assign(local_90);
        if ((cmMakefile *)local_c8._0_8_ != (cmMakefile *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
      else {
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"BINARY_DIR","");
        psVar5 = (string *)cmTarget::GetProperty(this,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        pcVar6 = cmMakefile::GetGlobalGenerator(local_e0->Makefile);
        if (psVar5 == (string *)0x0) {
          psVar5 = &cmValue::Empty_abi_cxx11_;
        }
        local_c8._0_8_ = cmGlobalGenerator::FindMakefile(pcVar6,psVar5);
        plVar3 = *(long **)(local_68._M_allocated_capacity +
                           ((ulong)local_c8._0_8_ % (ulong)local_68._8_8_) * 8);
        plVar8 = (long *)0x0;
        if ((plVar3 != (long *)0x0) &&
           (plVar8 = plVar3, plVar10 = (long *)*plVar3,
           (cmMakefile *)local_c8._0_8_ != (cmMakefile *)((long *)*plVar3)[1])) {
          while (plVar3 = (long *)*plVar10, plVar3 != (long *)0x0) {
            plVar8 = (long *)0x0;
            if (((ulong)plVar3[1] % (ulong)local_68._8_8_ !=
                 (ulong)local_c8._0_8_ % (ulong)local_68._8_8_) ||
               (plVar8 = plVar10, plVar10 = plVar3,
               (cmMakefile *)local_c8._0_8_ == (cmMakefile *)plVar3[1])) goto LAB_003bcb3a;
          }
          plVar8 = (long *)0x0;
        }
LAB_003bcb3a:
        if ((plVar8 == (long *)0x0) || (*plVar8 == 0)) {
          iVar4._M_current =
               (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmMakefile*,std::allocator<cmMakefile*>>::
            _M_realloc_insert<cmMakefile*const&>
                      ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)directory_makefiles,iVar4,
                       (cmMakefile **)local_c8);
          }
          else {
            *iVar4._M_current = (cmMakefile *)local_c8._0_8_;
            pppcVar1 = &(directory_makefiles->
                        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          local_100._M_dataplus._M_p = (pointer)&local_68;
          std::
          _Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<cmMakefile*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<cmMakefile*,false>>>>
                    ((_Hashtable<cmMakefile*,cmMakefile*,std::allocator<cmMakefile*>,std::__detail::_Identity,std::equal_to<cmMakefile*>,std::hash<cmMakefile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_100._M_dataplus._M_p,(string *)local_c8,&local_100);
        }
      }
      if (this == (cmTarget *)0x0) goto LAB_003bcbca;
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_d0);
  }
  bVar9 = true;
  if (((local_98->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (local_98->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) &&
     ((local_a8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (local_a8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4._M_current =
         (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (directory_makefiles->super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)directory_makefiles,iVar4,
                 &local_d8);
    }
    else {
      *iVar4._M_current = local_d8;
      pppcVar1 = &(directory_makefiles->
                  super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
LAB_003bcbcc:
  std::
  _Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_68);
  return bVar9;
LAB_003bcbca:
  bVar9 = false;
  goto LAB_003bcbcc;
}

Assistant:

bool HandleSourceFileDirectoryScopes(
  cmExecutionStatus& status, std::vector<std::string>& source_file_directories,
  std::vector<std::string>& source_file_target_directories,
  std::vector<cmMakefile*>& directory_makefiles)
{
  std::unordered_set<cmMakefile*> directory_makefiles_set;

  cmMakefile* current_dir_mf = &status.GetMakefile();
  if (!source_file_directories.empty()) {
    for (const std::string& dir_path : source_file_directories) {
      const std::string absolute_dir_path = cmSystemTools::CollapseFullPath(
        dir_path, current_dir_mf->GetCurrentSourceDirectory());
      cmMakefile* dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          absolute_dir_path);
      if (!dir_mf) {
        status.SetError(cmStrCat("given non-existent DIRECTORY ", dir_path));
        return false;
      }
      if (directory_makefiles_set.find(dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(dir_mf);
        directory_makefiles_set.insert(dir_mf);
      }
    }
  }

  if (!source_file_target_directories.empty()) {
    for (const std::string& target_name : source_file_target_directories) {
      cmTarget* target = current_dir_mf->FindTargetToUse(target_name);
      if (!target) {
        status.SetError(cmStrCat(
          "given non-existent target for TARGET_DIRECTORY ", target_name));
        return false;
      }
      cmValue target_source_dir = target->GetProperty("BINARY_DIR");
      cmMakefile* target_dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          *target_source_dir);

      if (directory_makefiles_set.find(target_dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(target_dir_mf);
        directory_makefiles_set.insert(target_dir_mf);
      }
    }
  }

  if (source_file_directories.empty() &&
      source_file_target_directories.empty()) {
    directory_makefiles.push_back(current_dir_mf);
  }
  return true;
}